

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symbol.c
# Opt level: O0

int symbol_parse_type_function_return(lgx_ast_t *ast,lgx_ast_node_t *node,lgx_type_function_t *fun)

{
  int iVar1;
  lgx_type_function_t *fun_local;
  lgx_ast_node_t *node_local;
  lgx_ast_t *ast_local;
  
  if (*(char *)node != '\"') {
    __assert_fail("node->type == TYPE_EXPRESSION",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/fcten[P]xscript/src/parser/symbol.c"
                  ,0xd3,
                  "int symbol_parse_type_function_return(lgx_ast_t *, lgx_ast_node_t *, lgx_type_function_t *)"
                 );
  }
  iVar1 = symbol_parse_type(ast,node,&fun->ret);
  if (iVar1 == 0) {
    if (((fun->ret).type != T_UNKNOWN) && (iVar1 = lgx_type_is_definite(&fun->ret), iVar1 == 0)) {
      symbol_error(ast,node,"return value has incomplete type\n");
      return 1;
    }
    ast_local._4_4_ = 0;
  }
  else {
    ast_local._4_4_ = 1;
  }
  return ast_local._4_4_;
}

Assistant:

static int symbol_parse_type_function_return(lgx_ast_t* ast, lgx_ast_node_t* node, lgx_type_function_t* fun) {
    assert(node->type == TYPE_EXPRESSION);

    if (symbol_parse_type(ast, node, &fun->ret)) {
        return 1;
    }

    if (fun->ret.type != T_UNKNOWN && !lgx_type_is_definite(&fun->ret)) {
        symbol_error(ast, node, "return value has incomplete type\n");
        return 1;
    }

    return 0;
}